

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::draw_halfedge_arrow(Mesh *this,Halfedge *h)

{
  Vector3D *pVVar1;
  DrawStyle *pDVar2;
  pointer pVVar3;
  pointer pHVar4;
  pointer this_00;
  double local_2c0;
  Vector3D local_2b8;
  double local_2a0;
  Vector3D local_298;
  Vector3D local_280;
  Vector3D local_268;
  Vector3D *local_250;
  Vector3D *c;
  double theta;
  Vector3D local_238;
  Vector3D local_220;
  Vector3D *local_208;
  Vector3D *t;
  Vector3D local_1f8;
  Vector3D local_1e0;
  Vector3D *local_1c8;
  Vector3D *s;
  Vector3D local_1b8;
  Vector3D local_1a0;
  Vector3D *local_188;
  Vector3D *b;
  Vector3D local_178;
  Vector3D local_160;
  Vector3D *local_148;
  Vector3D *a;
  Vector3D local_138;
  Vector3D local_120;
  Vector3D *local_108;
  Vector3D *v;
  Vector3D local_f8;
  Vector3D local_e0;
  Vector3D *local_c8;
  Vector3D *u;
  Vector3D *local_a8;
  Vector3D *e20;
  Vector3D *local_88;
  Vector3D *e12;
  Vector3D *local_68;
  Vector3D *e01;
  _List_const_iterator<CMU462::Halfedge> local_58;
  _List_const_iterator<CMU462::Vertex> local_50;
  Vector3D *local_48;
  Vector3D *p2;
  _List_const_iterator<CMU462::Vertex> local_38;
  Vector3D *local_30;
  Vector3D *p1;
  Vector3D *local_20;
  Vector3D *p0;
  Halfedge *h_local;
  Mesh *this_local;
  
  p0 = (Vector3D *)h;
  h_local = (Halfedge *)this;
  pDVar2 = get_draw_style(this,&h->super_HalfedgeElement);
  DrawStyle::style_halfedge(pDVar2);
  p1 = (Vector3D *)Halfedge::vertex((Halfedge *)p0);
  pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->
                     ((_List_const_iterator<CMU462::Vertex> *)&p1);
  local_20 = &pVVar3->position;
  p2 = (Vector3D *)Halfedge::next((Halfedge *)p0);
  pHVar4 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                     ((_List_const_iterator<CMU462::Halfedge> *)&p2);
  local_38._M_node = (_List_node_base *)Halfedge::vertex(pHVar4);
  pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_38);
  local_30 = &pVVar3->position;
  e01 = (Vector3D *)Halfedge::next((Halfedge *)p0);
  pHVar4 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                     ((_List_const_iterator<CMU462::Halfedge> *)&e01);
  local_58._M_node = (_List_node_base *)Halfedge::next(pHVar4);
  pHVar4 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_58);
  local_50._M_node = (_List_node_base *)Halfedge::vertex(pHVar4);
  pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_50);
  local_48 = &pVVar3->position;
  Vector3D::operator-((Vector3D *)&e12,local_30,local_20);
  local_68 = (Vector3D *)&e12;
  Vector3D::operator-((Vector3D *)&e20,local_48,local_30);
  local_88 = (Vector3D *)&e20;
  Vector3D::operator-((Vector3D *)&u,local_20,local_48);
  local_a8 = (Vector3D *)&u;
  Vector3D::operator-(&local_f8,local_68,local_a8);
  v = (Vector3D *)0x4000000000000000;
  Vector3D::operator/(&local_e0,&local_f8,(double *)&v);
  local_c8 = &local_e0;
  Vector3D::operator-(&local_138,local_88,local_68);
  a = (Vector3D *)0x4000000000000000;
  Vector3D::operator/(&local_120,&local_138,(double *)&a);
  pVVar1 = local_20;
  local_108 = &local_120;
  b = (Vector3D *)0x4014000000000000;
  Vector3D::operator/(&local_178,local_c8,(double *)&b);
  Vector3D::operator+(&local_160,pVVar1,&local_178);
  pVVar1 = local_30;
  local_148 = &local_160;
  s = (Vector3D *)0x4014000000000000;
  Vector3D::operator/(&local_1b8,local_108,(double *)&s);
  Vector3D::operator+(&local_1a0,pVVar1,&local_1b8);
  local_188 = &local_1a0;
  Vector3D::operator-(&local_1f8,local_188,local_148);
  t = (Vector3D *)0x4014000000000000;
  Vector3D::operator/(&local_1e0,&local_1f8,(double *)&t);
  local_1c8 = &local_1e0;
  theta = (double)Halfedge::face((Halfedge *)p0);
  this_00 = std::_List_const_iterator<CMU462::Face>::operator->
                      ((_List_const_iterator<CMU462::Face> *)&theta);
  Face::normal(&local_238,this_00);
  cross(&local_220,&local_238,local_1c8);
  pVVar1 = local_188;
  local_208 = &local_220;
  c = (Vector3D *)0x4004f1a6c638d03f;
  local_2a0 = cos(2.6179938779914944);
  CMU462::operator*(&local_298,&local_2a0,local_1c8);
  Vector3D::operator+(&local_280,pVVar1,&local_298);
  local_2c0 = sin((double)c);
  CMU462::operator*(&local_2b8,&local_2c0,local_208);
  Vector3D::operator+(&local_268,&local_280,&local_2b8);
  local_250 = &local_268;
  glBegin(3);
  glVertex3dv(local_148);
  glVertex3dv(local_188);
  glVertex3dv(local_250);
  glEnd();
  pDVar2 = get_draw_style(this,(HalfedgeElement *)p0);
  DrawStyle::style_reset(pDVar2);
  return;
}

Assistant:

void Mesh::draw_halfedge_arrow(const Halfedge *h) const {
  get_draw_style(h)->style_halfedge();

  const Vector3D& p0 = h->vertex()->position;
  const Vector3D& p1 = h->next()->vertex()->position;
  const Vector3D& p2 = h->next()->next()->vertex()->position;

  const Vector3D& e01 = p1-p0;
  const Vector3D& e12 = p2-p1;
  const Vector3D& e20 = p0-p2;

  const Vector3D& u = (e01 - e20) / 2;
  const Vector3D& v = (e12 - e01) / 2;

  const Vector3D& a = p0 + u / 5;
  const Vector3D& b = p1 + v / 5;

  const Vector3D& s = (b-a) / 5;
  const Vector3D& t = cross(h->face()->normal(), s);
  double theta = PI * 5 / 6;
  const Vector3D& c = b + cos(theta) * s + sin(theta) * t;

  glBegin(GL_LINE_STRIP);
  glVertex3dv(&a.x);
  glVertex3dv(&b.x);
  glVertex3dv(&c.x);
  glEnd();

  get_draw_style(h)->style_reset();
}